

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O0

int8_t __thiscall
I2Cdev::readWords(I2Cdev *this,uint8_t regAddr,uint8_t length,uint16_t *data,uint16_t timeout)

{
  FILE *pFVar1;
  int __fd;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  ssize_t sVar5;
  int fd;
  int8_t count;
  uint16_t timeout_local;
  uint16_t *data_local;
  uint8_t length_local;
  I2Cdev *pIStack_18;
  uint8_t regAddr_local;
  I2Cdev *this_local;
  
  data_local._6_1_ = length;
  data_local._7_1_ = regAddr;
  pIStack_18 = this;
  __fd = open(&(this->super_I2Cgeneric).field_0xd,2);
  pFVar1 = _stderr;
  if (__fd < 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(pFVar1,"Failed to open device: %s\n",pcVar4);
    this_local._7_1_ = -1;
  }
  else {
    iVar2 = ioctl(__fd,0x703,(ulong)(byte)(this->super_I2Cgeneric).field_0xc);
    pFVar1 = _stderr;
    if (iVar2 < 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(pFVar1,"Failed to select device: %s\n",pcVar4);
      close(__fd);
      this_local._7_1_ = -1;
    }
    else {
      sVar5 = write(__fd,(void *)((long)&data_local + 7),1);
      pFVar1 = _stderr;
      if (sVar5 == 1) {
        sVar5 = read(__fd,data,(long)(int)((uint)data_local._6_1_ << 1));
        pFVar1 = _stderr;
        this_local._7_1_ = (char)sVar5;
        if (this_local._7_1_ < '\0') {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          fprintf(pFVar1,"Failed to read device(%d): %s\n",(ulong)(uint)(int)this_local._7_1_,pcVar4
                 );
          close(__fd);
          this_local._7_1_ = -1;
        }
        else if ((int)this_local._7_1_ / 2 == (uint)data_local._6_1_) {
          close(__fd);
        }
        else {
          fprintf(_stderr,"Short read  from device, expected %d, got %d\n",(ulong)data_local._6_1_,
                  (ulong)(uint)(int)this_local._7_1_);
          close(__fd);
          this_local._7_1_ = -1;
        }
      }
      else {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(pFVar1,"Failed to write reg: %s\n",pcVar4);
        close(__fd);
        this_local._7_1_ = -1;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

int8_t I2Cdev::readWords(uint8_t regAddr, uint8_t length, uint16_t *data, uint16_t timeout) {
    //int8_t count = 0;

    // Use readBytes() and potential byteswap
    //printf("ReadWords() not implemented\n");
    // keep the compiler quiet
    /**data = 0;
    (void)regAddr;
    (void)length;
    (void)timeout;

    return count;*/
    int8_t count = 0;
    int fd = open(this->i2c_path, O_RDWR);

    if (fd < 0) {
        fprintf(stderr, "Failed to open device: %s\n", strerror(errno));
        return(-1);
    }
    if (ioctl(fd, I2C_SLAVE, this->address) < 0) {
        fprintf(stderr, "Failed to select device: %s\n", strerror(errno));
        close(fd);
        return(-1);
    }
    if (write(fd, &regAddr, 1) != 1) {
        fprintf(stderr, "Failed to write reg: %s\n", strerror(errno));
        close(fd);
        return(-1);
    }
    count = read(fd, data, length*2);
    if (count < 0) {
        fprintf(stderr, "Failed to read device(%d): %s\n", count, ::strerror(errno));
        close(fd);
        return(-1);
    } else if (count/2 != length) {
        fprintf(stderr, "Short read  from device, expected %d, got %d\n", length, count);
        close(fd);
        return(-1);
    }
    close(fd);

    // Suppress compiler warning
    (void)timeout;

    return count;
}